

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O3

void __thiscall
Assimp::LWO::AnimResolver::GetKeys
          (AnimResolver *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out,
          Envelope *_envl_x,Envelope *_envl_y,Envelope *_envl_z,uint _flags)

{
  pointer *ppaVar1;
  double dVar2;
  double dVar3;
  Envelope *pEVar4;
  double dVar5;
  long lVar6;
  ulong uVar7;
  pointer pKVar8;
  pointer paVar9;
  pointer pKVar10;
  ulong uVar11;
  pointer pKVar12;
  iterator __position;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *out_00;
  undefined4 uVar13;
  undefined4 uVar14;
  aiVectorKey fill;
  aiVectorKey local_118;
  Key local_100;
  undefined1 local_d8 [16];
  pointer local_c8;
  iterator iStack_c0;
  Key *local_b8;
  size_t sStack_b0;
  size_t local_a8;
  undefined1 local_98 [16];
  pointer local_88;
  iterator iStack_80;
  Key *local_78;
  size_t sStack_70;
  size_t local_68;
  undefined1 local_58 [16];
  pointer local_48;
  pointer pKStack_40;
  pointer local_38;
  size_t sStack_30;
  size_t local_28;
  
  this->envl_x = _envl_x;
  this->envl_y = _envl_y;
  this->envl_z = _envl_z;
  this->flags = _flags;
  local_58._0_4_ = 0;
  local_58._4_4_ = EnvelopeType_Unknown;
  local_58._8_4_ = PrePostBehaviour_Constant;
  local_58._12_4_ = PrePostBehaviour_Constant;
  local_48 = (pointer)0x0;
  pKStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  sStack_30 = 0;
  local_28 = 0;
  local_98._0_4_ = 0;
  local_98._4_4_ = EnvelopeType_Unknown;
  local_98._8_4_ = PrePostBehaviour_Constant;
  local_98._12_4_ = PrePostBehaviour_Constant;
  local_88 = (pointer)0x0;
  iStack_80._M_current = (Key *)0x0;
  local_78 = (Key *)0x0;
  sStack_70 = 0;
  local_68 = 0;
  local_d8._0_4_ = 0;
  local_d8._4_4_ = EnvelopeType_Unknown;
  local_d8._8_4_ = PrePostBehaviour_Constant;
  local_d8._12_4_ = PrePostBehaviour_Constant;
  local_c8 = (pointer)0x0;
  iStack_c0._M_current = (Key *)0x0;
  local_b8 = (Key *)0x0;
  sStack_b0 = 0;
  local_a8 = 0;
  local_100.inter = IT_LINE;
  local_100.params[0] = 0.0;
  local_100.params[1] = 0.0;
  local_100.params[2] = 0.0;
  local_100.params[3] = 0.0;
  local_100.params[4] = 0.0;
  local_100.time = 0.0;
  if ((_envl_x == (Envelope *)0x0) || (_envl_x->type != EnvelopeType_Scaling_X)) {
    if (((_envl_y == (Envelope *)0x0) || (_envl_y->type != EnvelopeType_Scaling_Y)) &&
       ((_envl_z == (Envelope *)0x0 || (_envl_z->type != EnvelopeType_Scaling_Z)))) {
      local_100.value = 0.0;
    }
    else {
      local_100.value = 1.0;
    }
    if (_envl_x == (Envelope *)0x0) {
      this->envl_x = (Envelope *)local_58;
      std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
      _M_realloc_insert<Assimp::LWO::Key_const&>
                ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)&local_48,
                 (iterator)0x0,&local_100);
      _envl_y = this->envl_y;
    }
  }
  else {
    local_100.value = 1.0;
  }
  if (_envl_y == (Envelope *)0x0) {
    this->envl_y = (Envelope *)local_98;
    if (iStack_80._M_current == local_78) {
      std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
      _M_realloc_insert<Assimp::LWO::Key_const&>
                ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)&local_88,iStack_80,
                 &local_100);
    }
    else {
      *(ulong *)((iStack_80._M_current)->params + 4) =
           CONCAT44(local_100._36_4_,local_100.params[4]);
      *(undefined8 *)(iStack_80._M_current)->params = local_100.params._0_8_;
      *(undefined8 *)((iStack_80._M_current)->params + 2) = local_100.params._8_8_;
      (iStack_80._M_current)->time = local_100.time;
      (iStack_80._M_current)->value = local_100.value;
      (iStack_80._M_current)->inter = local_100.inter;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
  }
  if (this->envl_z == (Envelope *)0x0) {
    this->envl_z = (Envelope *)local_d8;
    if (iStack_c0._M_current == local_b8) {
      std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>::
      _M_realloc_insert<Assimp::LWO::Key_const&>
                ((vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>> *)&local_c8,iStack_c0,
                 &local_100);
    }
    else {
      *(ulong *)((iStack_c0._M_current)->params + 4) =
           CONCAT44(local_100._36_4_,local_100.params[4]);
      *(undefined8 *)(iStack_c0._M_current)->params = local_100.params._0_8_;
      *(undefined8 *)((iStack_c0._M_current)->params + 2) = local_100.params._8_8_;
      (iStack_c0._M_current)->time = local_100.time;
      (iStack_c0._M_current)->value = local_100.value;
      (iStack_c0._M_current)->inter = local_100.inter;
      iStack_c0._M_current = iStack_c0._M_current + 1;
    }
  }
  if ((this->flags & 1) == 0) {
    uVar11 = ((long)(this->envl_x->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->envl_x->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar6 = (long)(this->envl_z->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->envl_z->keys).
                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar7 = lVar6 * -0x3333333333333333;
    if (uVar7 <= uVar11 && uVar11 + lVar6 * 0x3333333333333333 != 0) {
      uVar7 = uVar11;
    }
  }
  else {
    uVar7 = -(ulong)(this->sample_rate != 0.0);
    dVar5 = (double)(~uVar7 & 0x4059000000000000 | (ulong)this->sample_rate & uVar7);
    this->sample_delta = 1.0 / dVar5;
    dVar2 = (this->envl_z->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    uVar13 = SUB84(dVar2,0);
    uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
    dVar3 = (this->envl_y->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    if (dVar2 <= dVar3) {
      uVar13 = SUB84(dVar3,0);
      uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    dVar2 = (this->envl_x->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].time;
    if ((double)CONCAT44(uVar14,uVar13) <= dVar2) {
      uVar13 = SUB84(dVar2,0);
      uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    dVar5 = (double)CONCAT44(uVar14,uVar13) * dVar5;
    uVar7 = (ulong)dVar5;
    uVar7 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
  }
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(out,(uVar7 >> 1) + uVar7);
  pEVar4 = this->envl_y;
  pKVar8 = (this->envl_x->keys).
           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->cur_x)._M_current = pKVar8;
  pKVar10 = (pEVar4->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (this->cur_y)._M_current = pKVar10;
  pKVar12 = (this->envl_z->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->cur_z)._M_current = pKVar12;
  this->end_z = false;
  this->end_x = false;
  this->end_y = false;
  out_00 = (vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)0x0;
  do {
    local_118.mTime = 0.0;
    local_118.mValue.x = 0.0;
    local_118.mValue.y = 0.0;
    local_118.mValue.z = 0.0;
    dVar2 = pKVar8->time;
    dVar3 = pKVar10->time;
    uVar13 = SUB84(dVar3,0);
    uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
    if (((dVar2 != dVar3) || (dVar2 != pKVar12->time)) || (NAN(dVar2) || NAN(pKVar12->time))) {
      if ((dVar3 < dVar2) || (((ulong)out_00 & 1) != 0)) {
        if ((this->end_y & 1U) != 0) {
          if (((ulong)out_00 & 1) != 0) {
            pKVar8 = pKVar12;
          }
          uVar13 = SUB84(pKVar8->time,0);
          uVar14 = (undefined4)((ulong)pKVar8->time >> 0x20);
        }
      }
      else {
        dVar3 = pKVar12->time;
        uVar13 = SUB84(dVar3,0);
        uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
        if ((dVar2 < dVar3) || (this->end_z != false)) {
          uVar13 = SUB84(dVar2,0);
          uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
        }
      }
      InterpolateTrack(this,out_00,&local_118,(double)CONCAT44(uVar14,uVar13));
    }
    else {
      local_118.mValue.y = pKVar10->value;
      local_118.mValue.x = ((aiVector3D *)&pKVar8->value)->x;
      local_118.mValue.z = ((aiVector3D *)&pKVar12->value)->x;
      local_118.mTime = dVar2;
    }
    dVar2 = local_118.mTime;
    __position._M_current =
         (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVectorKey,std::allocator<aiVectorKey>>::_M_realloc_insert<aiVectorKey_const&>
                ((vector<aiVectorKey,std::allocator<aiVectorKey>> *)out,__position,&local_118);
    }
    else {
      *(ulong *)&((__position._M_current)->mValue).z = CONCAT44(local_118._20_4_,local_118.mValue.z)
      ;
      (__position._M_current)->mTime = local_118.mTime;
      ((__position._M_current)->mValue).x = local_118.mValue.x;
      ((__position._M_current)->mValue).y = local_118.mValue.y;
      ppaVar1 = &(out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    pKVar8 = (this->cur_x)._M_current;
    if (pKVar8->time <= dVar2) {
      if (pKVar8 == (this->envl_x->keys).
                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1) {
        this->end_x = true;
      }
      else {
        pKVar8 = pKVar8 + 1;
        (this->cur_x)._M_current = pKVar8;
      }
    }
    pKVar10 = (this->cur_y)._M_current;
    if (pKVar10->time <= dVar2) {
      if (pKVar10 ==
          (this->envl_y->keys).
          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
          super__Vector_impl_data._M_finish + -1) {
        this->end_y = true;
      }
      else {
        pKVar10 = pKVar10 + 1;
        (this->cur_y)._M_current = pKVar10;
      }
    }
    pKVar12 = (this->cur_z)._M_current;
    if (pKVar12->time <= dVar2) {
      __position._M_current =
           (aiVectorKey *)
           ((this->envl_z->keys).
            super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
            super__Vector_impl_data._M_finish + -1);
      if (pKVar12 == (pointer)__position._M_current) {
        this->end_z = true;
      }
      else {
        pKVar12 = pKVar12 + 1;
        (this->cur_z)._M_current = pKVar12;
      }
    }
    out_00 = (vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
             CONCAT71((int7)((ulong)__position._M_current >> 8),this->end_x);
  } while (((this->end_x != true) || (this->end_y != true)) || (this->end_z == false));
  if ((this->flags & 2) != 0) {
    for (paVar9 = (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        paVar9 != (out->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                  super__Vector_impl_data._M_finish; paVar9 = paVar9 + 1) {
      paVar9->mTime = paVar9->mTime - this->first;
    }
  }
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void AnimResolver::GetKeys(std::vector<aiVectorKey>& out,
    LWO::Envelope* _envl_x,
    LWO::Envelope* _envl_y,
    LWO::Envelope* _envl_z,
    unsigned int _flags)
{
    envl_x = _envl_x;
    envl_y = _envl_y;
    envl_z = _envl_z;
    flags  = _flags;

    // generate default channels if none are given
    LWO::Envelope def_x, def_y, def_z;
    LWO::Key key_dummy;
    key_dummy.time = 0.f;
    if ((envl_x && envl_x->type == LWO::EnvelopeType_Scaling_X) ||
        (envl_y && envl_y->type == LWO::EnvelopeType_Scaling_Y) ||
        (envl_z && envl_z->type == LWO::EnvelopeType_Scaling_Z)) {
        key_dummy.value = 1.f;
    }
    else key_dummy.value = 0.f;

    if (!envl_x) {
        envl_x = &def_x;
        envl_x->keys.push_back(key_dummy);
    }
    if (!envl_y) {
        envl_y = &def_y;
        envl_y->keys.push_back(key_dummy);
    }
    if (!envl_z) {
        envl_z = &def_z;
        envl_z->keys.push_back(key_dummy);
    }

    // guess how many keys we'll get
    size_t reserve;
    double sr = 1.;
    if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
        if (!sample_rate)
            sr = 100.f;
        else sr = sample_rate;
        sample_delta = 1.f / sr;

        reserve = (size_t)(
            std::max( envl_x->keys.rbegin()->time,
            std::max( envl_y->keys.rbegin()->time, envl_z->keys.rbegin()->time )) * sr);
    }
    else reserve = std::max(envl_x->keys.size(),std::max(envl_x->keys.size(),envl_z->keys.size()));
    out.reserve(reserve+(reserve>>1));

    // Iterate through all three arrays at once - it's tricky, but
    // rather interesting to implement.
    cur_x = envl_x->keys.begin();
    cur_y = envl_y->keys.begin();
    cur_z = envl_z->keys.begin();

    end_x = end_y = end_z = false;
    while (1) {

        aiVectorKey fill;

        if ((*cur_x).time == (*cur_y).time && (*cur_x).time == (*cur_z).time ) {

            // we have a keyframe for all of them defined .. this means
            // we don't need to interpolate here.
            fill.mTime = (*cur_x).time;

            fill.mValue.x = (*cur_x).value;
            fill.mValue.y = (*cur_y).value;
            fill.mValue.z = (*cur_z).value;

            // subsample animation track
            if (flags & AI_LWO_ANIM_FLAG_SAMPLE_ANIMS) {
                //SubsampleAnimTrack(out,cur_x, cur_y, cur_z, d, sample_delta);
            }
        }

        // Find key with lowest time value
        else if ((*cur_x).time <= (*cur_y).time && !end_x) {

            if ((*cur_z).time <= (*cur_x).time && !end_z) {
                InterpolateTrack(out,fill,(*cur_z).time);
            }
            else {
                InterpolateTrack(out,fill,(*cur_x).time);
            }
        }
        else if ((*cur_z).time <= (*cur_y).time && !end_y)  {
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else if (!end_y) {
            // welcome on the server, y
            InterpolateTrack(out,fill,(*cur_y).time);
        }
        else {
            // we have reached the end of at least 2 channels,
            // only one is remaining. Extrapolate the 2.
            if (end_y) {
                InterpolateTrack(out,fill,(end_x ? (*cur_z) : (*cur_x)).time);
            }
            else if (end_x) {
                InterpolateTrack(out,fill,(end_z ? (*cur_y) : (*cur_z)).time);
            }
            else { // if (end_z)
                InterpolateTrack(out,fill,(end_y ? (*cur_x) : (*cur_y)).time);
            }
        }
        double lasttime = fill.mTime;
        out.push_back(fill);

        if (lasttime >= (*cur_x).time) {
            if (cur_x != envl_x->keys.end()-1)
                ++cur_x;
            else end_x = true;
        }
        if (lasttime >= (*cur_y).time) {
            if (cur_y != envl_y->keys.end()-1)
                ++cur_y;
            else end_y = true;
        }
        if (lasttime >= (*cur_z).time) {
            if (cur_z != envl_z->keys.end()-1)
                ++cur_z;
            else end_z = true;
        }

        if( end_x && end_y && end_z ) /* finished? */
            break;
    }

    if (flags & AI_LWO_ANIM_FLAG_START_AT_ZERO) {
        for (std::vector<aiVectorKey>::iterator it = out.begin(); it != out.end(); ++it)
            (*it).mTime -= first;
    }
}